

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int av1_fp_compute_num_enc_workers(AV1_COMP *cpi)

{
  long in_RDI;
  int num_mb_cols_in_tile;
  int num_mb_rows_in_tile;
  int col;
  int row;
  TileInfo tile_info;
  int total_num_threads_row_mt;
  int tile_rows;
  int tile_cols;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_44;
  int local_40;
  TileInfo local_3c;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  long local_10;
  int local_4;
  
  local_18 = in_RDI + 0x3bf80;
  local_1c = *(int *)(in_RDI + 0x42020);
  local_20 = *(int *)(in_RDI + 0x42024);
  local_24 = 0;
  if (*(int *)(in_RDI + 0x42728) < 2) {
    local_4 = 1;
  }
  else {
    local_10 = in_RDI;
    for (local_40 = 0; local_40 < local_20; local_40 = local_40 + 1) {
      for (local_44 = 0; local_44 < local_1c; local_44 = local_44 + 1) {
        av1_tile_init((TileInfo *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0,
                      0x25163d);
        in_stack_ffffffffffffffb0 =
             av1_get_unit_rows_in_tile(&local_3c,*(BLOCK_SIZE *)(local_10 + 0x9d514));
        in_stack_ffffffffffffffb4 =
             av1_get_unit_cols_in_tile(&local_3c,*(BLOCK_SIZE *)(local_10 + 0x9d514));
        if (in_stack_ffffffffffffffb4 + 1 >> 1 < in_stack_ffffffffffffffb0) {
          in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb4 + 1 >> 1;
        }
        local_24 = in_stack_ffffffffffffffb0 + local_24;
      }
    }
    local_4 = local_24;
    if (*(int *)(local_10 + 0x42728) < local_24) {
      local_4 = *(int *)(local_10 + 0x42728);
    }
  }
  return local_4;
}

Assistant:

int av1_fp_compute_num_enc_workers(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int total_num_threads_row_mt = 0;
  TileInfo tile_info;

  if (cpi->oxcf.max_threads <= 1) return 1;

  for (int row = 0; row < tile_rows; row++) {
    for (int col = 0; col < tile_cols; col++) {
      av1_tile_init(&tile_info, cm, row, col);
      const int num_mb_rows_in_tile =
          av1_get_unit_rows_in_tile(&tile_info, cpi->fp_block_size);
      const int num_mb_cols_in_tile =
          av1_get_unit_cols_in_tile(&tile_info, cpi->fp_block_size);
      total_num_threads_row_mt +=
          AOMMIN((num_mb_cols_in_tile + 1) >> 1, num_mb_rows_in_tile);
    }
  }
  return AOMMIN(cpi->oxcf.max_threads, total_num_threads_row_mt);
}